

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdDecomposeSingleVarOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v)

{
  int nWords_00;
  int iVar1;
  int nWords;
  int v_local;
  int nVars_local;
  int *pVars_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  nWords_00 = Abc_TtWordNum(nVars);
  if ((*pTruth & 1) == 0) {
    iVar1 = Abc_TtCof0IsConst0(pTruth,nWords_00,v);
    if (iVar1 != 0) {
      Dau_DsdWriteString(p,"(");
      Abc_TtCofactor1(pTruth,nWords_00,v);
      goto LAB_005e5a57;
    }
  }
  else {
    iVar1 = Abc_TtCof0IsConst1(pTruth,nWords_00,v);
    if (iVar1 != 0) {
      Dau_DsdWriteString(p,"!(");
      Abc_TtCofactor1(pTruth,nWords_00,v);
      Abc_TtNot(pTruth,nWords_00);
      goto LAB_005e5a57;
    }
  }
  if ((long)pTruth[nWords_00 + -1] < 0) {
    iVar1 = Abc_TtCof1IsConst1(pTruth,nWords_00,v);
    if (iVar1 != 0) {
      Dau_DsdWriteString(p,"!(!");
      Abc_TtCofactor0(pTruth,nWords_00,v);
      Abc_TtNot(pTruth,nWords_00);
      goto LAB_005e5a57;
    }
  }
  else {
    iVar1 = Abc_TtCof1IsConst0(pTruth,nWords_00,v);
    if (iVar1 != 0) {
      Dau_DsdWriteString(p,"(!");
      Abc_TtCofactor0(pTruth,nWords_00,v);
      goto LAB_005e5a57;
    }
  }
  iVar1 = Abc_TtCofsOpposite(pTruth,nWords_00,v);
  if (iVar1 == 0) {
    return 0;
  }
  Dau_DsdWriteString(p,"[");
  Abc_TtCofactor0(pTruth,nWords_00,v);
  p->uConstMask = 1 << ((byte)p->nConsts & 0x1f) | p->uConstMask;
LAB_005e5a57:
  p->nConsts = p->nConsts + 1;
  Dau_DsdWriteVar(p,pVars[v],0);
  pVars[v] = pVars[nVars + -1];
  Abc_TtSwapVars(pTruth,nVars,v,nVars + -1);
  return 1;
}

Assistant:

static inline int Dau_DsdDecomposeSingleVarOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v )
{
    int nWords = Abc_TtWordNum(nVars);
    // consider negative cofactors
    if ( pTruth[0] & 1 )
    {        
        if ( Abc_TtCof0IsConst1( pTruth, nWords, v ) ) // !(ax)
        {
            Dau_DsdWriteString( p, "!(" );
            Abc_TtCofactor1( pTruth, nWords, v );
            Abc_TtNot( pTruth, nWords );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_TtCof0IsConst0( pTruth, nWords, v ) ) // ax
        {
            Dau_DsdWriteString( p, "(" );
            Abc_TtCofactor1( pTruth, nWords, v );
            goto finish;            
        }
    }
    // consider positive cofactors
    if ( pTruth[nWords-1] >> 63 )
    {        
        if ( Abc_TtCof1IsConst1( pTruth, nWords, v ) ) // !(!ax)
        {
            Dau_DsdWriteString( p, "!(!" );
            Abc_TtCofactor0( pTruth, nWords, v );
            Abc_TtNot( pTruth, nWords );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_TtCof1IsConst0( pTruth, nWords, v ) ) // !ax
        {
            Dau_DsdWriteString( p, "(!" );
            Abc_TtCofactor0( pTruth, nWords, v );
            goto finish;            
        }
    }
    // consider equal cofactors
    if ( Abc_TtCofsOpposite( pTruth, nWords, v ) ) // [ax]
    {
        Dau_DsdWriteString( p, "[" );
        Abc_TtCofactor0( pTruth, nWords, v );
        p->uConstMask |= (1 << p->nConsts);
        goto finish;            
    }
    return 0;

finish:
    p->nConsts++;
    Dau_DsdWriteVar( p, pVars[v], 0 );
    pVars[v] = pVars[nVars-1];
    Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
    return 1;
}